

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O1

void add_monitor(ecs_vector_t **array,ecs_query_t *query,int32_t matched_table_index)

{
  int32_t iVar1;
  undefined8 *puVar2;
  void *__base;
  size_t __nmemb;
  
  puVar2 = (undefined8 *)_ecs_vector_add(array,0x10,0x10);
  _ecs_assert(puVar2 != (undefined8 *)0x0,0xc,(char *)0x0,"m != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0xe1);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = query;
    *(int32_t *)(puVar2 + 1) = matched_table_index;
    __base = _ecs_vector_first(*array,0x10,0x10);
    iVar1 = ecs_vector_count(*array);
    __nmemb = ecs_to_size_t((long)iVar1);
    qsort(__base,__nmemb,0x10,compare_matched_query);
    return;
  }
  __assert_fail("m != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/table.c"
                ,0xe1,"void add_monitor(ecs_vector_t **, ecs_query_t *, int32_t)");
}

Assistant:

static
void add_monitor(
    ecs_vector_t **array,
    ecs_query_t *query,
    int32_t matched_table_index)
{
    /* Add the system to a list that contains all OnSet systems matched with
     * this table. This makes it easy to get the list of systems that need to be
     * executed when all components are set, like when new_w_data is used */
    ecs_matched_query_t *m = ecs_vector_add(array, ecs_matched_query_t);
    ecs_assert(m != NULL, ECS_INTERNAL_ERROR, NULL);

    m->query = query;
    m->matched_table_index = matched_table_index;

    /* Sort the system list so that it is easy to get the difference OnSet
     * OnSet systems between two tables. */
    qsort(
        ecs_vector_first(*array, ecs_matched_query_t), 
        ecs_to_size_t(ecs_vector_count(*array)),
        ECS_SIZEOF(ecs_matched_query_t), 
        compare_matched_query);
}